

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

void __thiscall
MT32Emu::RendererImpl<float>::doRenderAndConvert<short>
          (RendererImpl<float> *this,short *stereoStream,Bit32u len)

{
  Bit32u len_00;
  float renderingBuffer [8192];
  float afStack_8038 [8194];
  
  for (; len != 0; len = len - len_00) {
    len_00 = 0x1000;
    if (len < 0x1000) {
      len_00 = len;
    }
    doRender(this,afStack_8038,len_00);
    convertSampleFormat<float,short>(afStack_8038,stereoStream,len_00 * 2);
    stereoStream = (short *)((long)stereoStream + (ulong)(len_00 * 4));
  }
  return;
}

Assistant:

void RendererImpl<Sample>::doRenderAndConvert(O *stereoStream, Bit32u len) {
	Sample renderingBuffer[MAX_SAMPLES_PER_RUN << 1];
	while (len > 0) {
		Bit32u thisPassLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
		doRender(renderingBuffer, thisPassLen);
		convertSampleFormat(renderingBuffer, stereoStream, thisPassLen << 1);
		stereoStream += thisPassLen << 1;
		len -= thisPassLen;
	}
}